

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  ulong uVar1;
  pointer pcVar2;
  const_iterator cVar3;
  pointer pCVar4;
  long lVar5;
  string *in_R8;
  ulong uVar6;
  const_iterator start;
  const_iterator end;
  string padding;
  string col;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  pCVar4 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_columns->
      super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>)._M_impl
      .super__Vector_impl_data._M_finish != pCVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar1 = *(ulong *)((long)&pCVar4->m_width + lVar5);
      pcVar2 = (this->m_iterators).
               super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      start.m_string =
           (string *)
           (*(long *)((long)&(pCVar4->m_string).m_string._M_dataplus._M_p + lVar5) +
           *(long *)((long)&(pCVar4->m_string).m_string._M_string_length + lVar5));
      cVar3._M_current = *(char **)((long)&(pcVar2->m_lineStart).m_it._M_current + lVar5);
      if (((string *)cVar3._M_current == start.m_string) &&
         ((long)&(pCVar4->m_string).m_string._M_dataplus._M_p + lVar5 ==
          *(long *)((long)&pcVar2->m_column + lVar5))) {
        in_R8 = (string *)0x20;
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,(char)uVar1);
      }
      else {
        start.m_it._M_current = cVar3._M_current;
        end.m_it._M_current = *(char **)((long)&(pcVar2->m_lineEnd).m_it._M_current + lVar5);
        end.m_string = in_R8;
        Column::const_iterator::addIndentAndSuffix_abi_cxx11_
                  (&local_50,(const_iterator *)((long)&pcVar2->m_column + lVar5),start,end);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        local_70 = 0;
        *local_78 = 0;
        if (local_50._M_string_length <= uVar1 && uVar1 - local_50._M_string_length != 0) {
          in_R8 = (string *)0x20;
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_78,0,0,(char)(uVar1 - local_50._M_string_length));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar6 = uVar6 + 1;
      pCVar4 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while (uVar6 < (ulong)((long)(this->m_columns->
                                   super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 6))
    ;
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                const auto width = m_columns[i].width();
                if ( m_iterators[i] != m_columns[i].end() ) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if ( col.size() < width ) {
                        padding.append( width - col.size(), ' ' );
                    }
                } else {
                    padding.append( width, ' ' );
                }
            }
            return row;
        }